

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::AssertionItemPortListSyntax*&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          ExpressionSyntax *args_5,Token *args_6)

{
  Token let;
  Token identifier;
  Token equals;
  Token semi;
  LetDeclarationSyntax *this_00;
  Token *args_local_4;
  AssertionItemPortListSyntax **args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (LetDeclarationSyntax *)allocate(this,0x90,8);
  let.kind = args_1->kind;
  let._2_1_ = args_1->field_0x2;
  let.numFlags.raw = (args_1->numFlags).raw;
  let.rawLen = args_1->rawLen;
  let.info = args_1->info;
  identifier.kind = args_2->kind;
  identifier._2_1_ = args_2->field_0x2;
  identifier.numFlags.raw = (args_2->numFlags).raw;
  identifier.rawLen = args_2->rawLen;
  identifier.info = args_2->info;
  equals.kind = args_4->kind;
  equals._2_1_ = args_4->field_0x2;
  equals.numFlags.raw = (args_4->numFlags).raw;
  equals.rawLen = args_4->rawLen;
  equals.info = args_4->info;
  semi.kind = args_6->kind;
  semi._2_1_ = args_6->field_0x2;
  semi.numFlags.raw = (args_6->numFlags).raw;
  semi.rawLen = args_6->rawLen;
  semi.info = args_6->info;
  slang::syntax::LetDeclarationSyntax::LetDeclarationSyntax
            (this_00,args,let,identifier,*args_3,equals,args_5,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }